

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

float3 tinyusdz::vnormalize(float3 *a,float eps)

{
  float fVar1;
  const_reference pvVar2;
  float fVar3;
  float3 fVar4;
  float local_3c;
  float len;
  float eps_local;
  float3 *a_local;
  
  fVar3 = vlength(a);
  local_3c = eps;
  if (eps < fVar3) {
    local_3c = fVar3;
  }
  pvVar2 = std::array<float,_3UL>::operator[](a,0);
  fVar3 = *pvVar2;
  pvVar2 = std::array<float,_3UL>::operator[](a,1);
  fVar1 = *pvVar2;
  pvVar2 = std::array<float,_3UL>::operator[](a,2);
  fVar4._M_elems[0] = fVar3 / local_3c;
  fVar4._M_elems[1] = fVar1 / local_3c;
  fVar4._M_elems[2] = *pvVar2 / local_3c;
  return (float3)fVar4._M_elems;
}

Assistant:

value::float3 vnormalize(const value::float3 &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::float3({a[0] / len, a[1] / len, a[2] / len});
}